

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

void __thiscall ACSStringPool::ReadStrings(ACSStringPool *this,FSerializer *file,char *key)

{
  PoolEntry *pPVar1;
  char *data;
  bool bVar2;
  uint in_EAX;
  uint uVar3;
  DWORD DVar4;
  FSerializer *arc;
  ulong uVar5;
  long lVar6;
  TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry> *__range2;
  uint ii;
  int poolsize;
  undefined8 local_38;
  
  uVar3 = (this->Pool).Count;
  local_38._0_4_ = in_EAX;
  if (uVar3 != 0) {
    TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry>::DoDelete(&this->Pool,0,uVar3 - 1);
    (this->Pool).Count = 0;
  }
  memset(this->PoolBuckets,0xff,0x3ec);
  this->FirstFreeEntry = 0;
  bVar2 = FSerializer::BeginObject(file,key);
  if (bVar2) {
    local_38 = (ulong)(uint)local_38;
    ::Serialize(file,"poolsize",(int32_t *)((long)&local_38 + 4),(int32_t *)0x0);
    TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry>::Resize(&this->Pool,local_38._4_4_);
    uVar5 = (ulong)(this->Pool).Count;
    if (uVar5 != 0) {
      pPVar1 = (this->Pool).Array;
      lVar6 = 0;
      do {
        *(undefined8 *)((long)&pPVar1->Next + lVar6) = 0xfffffffe;
        lVar6 = lVar6 + 0x18;
      } while (uVar5 * 0x18 != lVar6);
    }
    bVar2 = FSerializer::BeginArray(file,"pool");
    if ((bVar2) && (uVar3 = FSerializer::ArraySize(file), 0 < (int)uVar3)) {
      do {
        bVar2 = FSerializer::BeginObject(file,(char *)0x0);
        if (bVar2) {
          local_38 = CONCAT44(local_38._4_4_,0xffffffff);
          ::Serialize(file,"index",(uint32_t *)&local_38,(uint32_t *)0x0);
          if ((uint)local_38 < (this->Pool).Count) {
            arc = ::Serialize(file,"string",&(this->Pool).Array[local_38 & 0xffffffff].Str,
                              (FString *)0x0);
            ::Serialize(arc,"lockcount",&(this->Pool).Array[local_38 & 0xffffffff].LockCount,
                        (uint32_t *)0x0);
            data = (this->Pool).Array[local_38 & 0xffffffff].Str.Chars;
            DVar4 = SuperFastHash(data,(ulong)*(uint *)(data + -0xc));
            pPVar1 = (this->Pool).Array;
            pPVar1[local_38 & 0xffffffff].Hash = DVar4;
            pPVar1[local_38 & 0xffffffff].Next = this->PoolBuckets[DVar4 % 0xfb];
            this->PoolBuckets[DVar4 % 0xfb] = (uint)local_38;
          }
          FSerializer::EndObject(file);
        }
        uVar3 = uVar3 - 1;
      } while (uVar3 != 0);
    }
  }
  return;
}

Assistant:

void ACSStringPool::ReadStrings(FSerializer &file, const char *key)
{
	Clear();

	if (file.BeginObject(key))
	{
		int poolsize = 0;

		file("poolsize", poolsize);
		Pool.Resize(poolsize);
		for (auto &p : Pool)
		{
			p.Next = FREE_ENTRY;
			p.LockCount = 0;
		}
		if (file.BeginArray("pool"))
		{
			int j = file.ArraySize();
			for (int i = 0; i < j; i++)
			{
				if (file.BeginObject(nullptr))
				{
					unsigned ii = UINT_MAX;
					file("index", ii);
					if (ii < Pool.Size())
					{
						file("string", Pool[ii].Str)
							("lockcount", Pool[ii].LockCount);

						unsigned h = SuperFastHash(Pool[ii].Str, Pool[ii].Str.Len());
						unsigned bucketnum = h % NUM_BUCKETS;
						Pool[ii].Hash = h;
						Pool[ii].Next = PoolBuckets[bucketnum];
						PoolBuckets[bucketnum] = ii;
					}
					file.EndObject();
				}
			}
		}
	}
}